

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

string * __thiscall Lexer::DescribeLastError_abi_cxx11_(string *__return_storage_ptr__,Lexer *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((this->last_token_ == (char *)0x0) || (*this->last_token_ != '\t')) {
    __s = "lexing error";
    __a = &local_a;
  }
  else {
    __s = "tabs are not allowed, use spaces";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

string Lexer::DescribeLastError() {
  if (last_token_) {
    switch (last_token_[0]) {
    case '\t':
      return "tabs are not allowed, use spaces";
    }
  }
  return "lexing error";
}